

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O2

void CSOAA::make_single_prediction(ldf *data,single_learner *base,example *ec)

{
  wclass *pwVar1;
  size_t sVar2;
  uint64_t uVar3;
  wclass *pwVar4;
  wclass *pwVar5;
  
  pwVar1 = (ec->l).cs.costs._begin;
  sVar2 = (ec->l).cs.costs.erase_count;
  pwVar4 = (ec->l).cs.costs._end;
  pwVar5 = (ec->l).cs.costs.end_array;
  LabelDict::add_example_namespace_from_memory(&data->label_features,ec,(ulong)pwVar1->class_index);
  (ec->l).multi.label = 0x7f7fffff;
  (ec->l).simple.initial = 0.0;
  uVar3 = (ec->super_example_predict).ft_offset;
  (ec->super_example_predict).ft_offset = data->ft_offset;
  LEARNER::learner<char,_example>::predict(base,ec,0);
  (ec->super_example_predict).ft_offset = uVar3;
  pwVar1->partial_prediction = ec->partial_prediction;
  LabelDict::del_example_namespace_from_memory(&data->label_features,ec,(ulong)pwVar1->class_index);
  (ec->l).cs.costs._begin = pwVar1;
  (ec->l).cs.costs._end = pwVar4;
  (ec->l).cs.costs.end_array = pwVar5;
  (ec->l).cs.costs.erase_count = sVar2;
  return;
}

Assistant:

void make_single_prediction(ldf& data, single_learner& base, example& ec)
{
  COST_SENSITIVE::label ld = ec.l.cs;
  label_data simple_label;
  simple_label.initial = 0.;
  simple_label.label = FLT_MAX;

  LabelDict::add_example_namespace_from_memory(data.label_features, ec, ld.costs[0].class_index);

  ec.l.simple = simple_label;
  uint64_t old_offset = ec.ft_offset;
  ec.ft_offset = data.ft_offset;
  base.predict(ec);  // make a prediction
  ec.ft_offset = old_offset;
  ld.costs[0].partial_prediction = ec.partial_prediction;

  LabelDict::del_example_namespace_from_memory(data.label_features, ec, ld.costs[0].class_index);
  ec.l.cs = ld;
}